

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testc.c
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Boolean BVar4;
  undefined1 local_1c [4];
  undefined1 local_18 [8];
  
  MPI_Init(local_1c,local_18);
  GA_Initialize();
  iVar1 = GA_Nodeid();
  iVar2 = GA_Nnodes();
  if (iVar1 == 0) {
    iVar3 = GA_Uses_fapi();
    if (iVar3 != 0) {
      GA_Error("Program runs with C array API only",1);
    }
    printf("Using %ld processes\n",(long)iVar2);
    fflush(_stdout);
  }
  iVar2 = (int)(20000 / (long)iVar2);
  BVar4 = MA_init(0x3f5,(long)iVar2,(long)iVar2);
  if (BVar4 == 0) {
    GA_Error("MA_init failed",iVar2 * 2);
  }
  do_work();
  if (iVar1 == 0) {
    puts("All tests successful");
  }
  GA_Terminate();
  MPI_Finalize();
  return 0;
}

Assistant:

int main(int argc, char **argv)
{
int heap=20000, stack=20000;
int me, nproc;

    MP_INIT(argc,argv);

    GA_INIT(argc,argv);                            /* initialize GA */
    me=GA_Nodeid(); 
    nproc=GA_Nnodes();
    if(me==0) {
       if(GA_Uses_fapi())GA_Error("Program runs with C array API only",1);
       printf("Using %ld processes\n",(long)nproc);
       fflush(stdout);
    }

    heap /= nproc;
    stack /= nproc;
    if(! MA_init(MT_F_DBL, stack, heap)) 
       GA_Error("MA_init failed",stack+heap);  /* initialize memory allocator*/ 
    
    do_work();

    if (me == 0) printf("All tests successful\n");

    GA_Terminate();
    MP_FINALIZE();

    return 0;
}